

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_decrypt_esni
              (ptls_context_t *ctx,ptls_iovec_t *server_name,ptls_esni_secret_t **secret,
              st_ptls_client_hello_t *ch)

{
  ptls_esni_context_t **pppVar1;
  uint16_t group;
  ptls_esni_context_t *ppVar2;
  ptls_cipher_suite_t *ppVar3;
  anon_struct_72_2_510fbff9 *paVar4;
  _func_void_st_ptls_aead_context_t_ptr *p_Var5;
  ptls_aead_context_t *__ptr;
  int iVar6;
  int iVar7;
  ptls_esni_secret_t *ppVar8;
  ptls_aead_context_t *__ptr_00;
  size_t sVar9;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **pp_Var10;
  ptls_cipher_suite_t *ppVar11;
  ptls_key_exchange_context_t *ppVar12;
  int iVar13;
  size_t __size;
  ptls_key_exchange_context_t **pppVar14;
  ptls_esni_context_t **pppVar15;
  uint8_t *end;
  ptls_iovec_t found_name;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **local_50;
  ptls_aead_context_t *local_48;
  ptls_iovec_t local_40;
  
  local_48 = (st_ptls_aead_context_t *)0x0;
  if (*secret != (ptls_esni_secret_t *)0x0) {
    __assert_fail("*secret == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0xbff,
                  "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                 );
  }
  ppVar8 = (ptls_esni_secret_t *)calloc(1,0xd0);
  *secret = ppVar8;
  if (ppVar8 == (ptls_esni_secret_t *)0x0) {
    return 0x201;
  }
  pppVar15 = ctx->esni;
  iVar13 = 0x2f;
  ppVar2 = *pppVar15;
  while (iVar7 = iVar13, ppVar2 != (ptls_esni_context_t *)0x0) {
    ppVar11 = ppVar2->cipher_suites->cipher_suite;
    if (ppVar11 == (ptls_cipher_suite_t *)0x0) break;
    ppVar3 = (ch->esni).cipher;
    paVar4 = ppVar2->cipher_suites;
    while (ppVar11->id != ppVar3->id) {
      ppVar11 = paVar4[1].cipher_suite;
      paVar4 = paVar4 + 1;
      if (ppVar11 == (ptls_cipher_suite_t *)0x0) goto LAB_00114ebe;
    }
    iVar6 = bcmp(paVar4->record_digest,(ch->esni).record_digest,ppVar3->hash->digest_size);
    if (iVar6 == 0) {
      ppVar8->version = ppVar2->version;
      pppVar14 = ppVar2->key_exchanges;
      ppVar12 = *pppVar14;
      if (ppVar12 != (ptls_key_exchange_context_t *)0x0) {
        group = ((ch->esni).key_share)->id;
        goto LAB_00114e49;
      }
      break;
    }
    pppVar1 = pppVar15 + 1;
    pppVar15 = pppVar15 + 1;
    ppVar2 = *pppVar1;
  }
  goto LAB_00114ebe;
  while( true ) {
    ppVar12 = pppVar14[1];
    pppVar14 = pppVar14 + 1;
    if (ppVar12 == (ptls_key_exchange_context_t *)0x0) break;
LAB_00114e49:
    if (ppVar12->algo->id == group) {
      iVar7 = build_esni_contents_hash
                        (((ch->esni).cipher)->hash,ppVar8->esni_contents_hash,
                         (ch->esni).record_digest,group,(ch->esni).peer_key,ch->random_bytes);
      if ((iVar7 == 0) &&
         (iVar7 = (*(*pppVar14)->on_exchange)(pppVar14,0,&(*secret)->secret,(ch->esni).peer_key),
         iVar7 == 0)) {
        ppVar11 = (ch->esni).cipher;
        __size = (ch->esni).encrypted_sni.len - ppVar11->aead->tag_size;
        iVar7 = iVar13;
        if (__size == (ulong)(*pppVar15)->padded_length + 0x10) {
          __ptr_00 = (ptls_aead_context_t *)malloc(__size);
          if (__ptr_00 == (st_ptls_aead_context_t *)0x0) {
            iVar7 = 0x201;
          }
          else {
            iVar7 = create_esni_aead(&local_48,0,ppVar11,(*secret)->secret,
                                     (*secret)->esni_contents_hash);
            __ptr = local_48;
            if (iVar7 == 0) {
              sVar9 = (*local_48->do_decrypt)
                                (local_48,__ptr_00,(ch->esni).encrypted_sni.base,
                                 (ch->esni).encrypted_sni.len,0,(ch->key_shares).base,
                                 (ch->key_shares).len);
              if (sVar9 == (ulong)(*pppVar15)->padded_length + 0x10) {
                (*__ptr->dispose_crypto)(__ptr);
                free(__ptr);
                iVar7 = 0x2f;
                if (0xf < (ulong)(*pppVar15)->padded_length) {
                  end = (uint8_t *)((long)&__ptr_00->algo + (ulong)(*pppVar15)->padded_length);
                  ppVar8 = *secret;
                  p_Var5 = __ptr_00->dispose_crypto;
                  *(st_ptls_aead_algorithm_t **)ppVar8->nonce = __ptr_00->algo;
                  *(_func_void_st_ptls_aead_context_t_ptr **)(ppVar8->nonce + 8) = p_Var5;
                  local_50 = &__ptr_00->do_xor_iv;
                  iVar7 = client_hello_decode_server_name(&local_40,(uint8_t **)&local_50,end);
                  pp_Var10 = local_50;
                  if (iVar7 == 0) {
                    while( true ) {
                      if (pp_Var10 == (_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **)end)
                      {
                        memmove(__ptr_00,local_40.base,local_40.len);
                        server_name->base = (uint8_t *)__ptr_00;
                        server_name->len = local_40.len;
                        return 0;
                      }
                      if (*(uint8_t *)pp_Var10 != '\0') break;
                      pp_Var10 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **)
                                 ((long)pp_Var10 + 1);
                    }
                    iVar7 = 0x2f;
                  }
                }
                goto LAB_00115012;
              }
              free(__ptr_00);
              iVar7 = 0x33;
              goto LAB_00115008;
            }
            free(__ptr_00);
            if (__ptr != (st_ptls_aead_context_t *)0x0) {
LAB_00115008:
              (*__ptr->dispose_crypto)(__ptr);
              __ptr_00 = __ptr;
LAB_00115012:
              free(__ptr_00);
            }
          }
        }
      }
      break;
    }
  }
LAB_00114ebe:
  if (*secret != (ptls_esni_secret_t *)0x0) {
    free_esni_secret(secret,1);
  }
  return iVar7;
}

Assistant:

static int client_hello_decrypt_esni(ptls_context_t *ctx, ptls_iovec_t *server_name, ptls_esni_secret_t **secret,
                                     struct st_ptls_client_hello_t *ch)
{
    ptls_esni_context_t **esni;
    ptls_key_exchange_context_t **key_share_ctx;
    uint8_t *decrypted = NULL;
    ptls_aead_context_t *aead = NULL;
    int ret;

    /* allocate secret */
    assert(*secret == NULL);
    if ((*secret = malloc(sizeof(**secret))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    memset(*secret, 0, sizeof(**secret));

    /* find the matching esni structure */
    for (esni = ctx->esni; *esni != NULL; ++esni) {
        size_t i;
        for (i = 0; (*esni)->cipher_suites[i].cipher_suite != NULL; ++i)
            if ((*esni)->cipher_suites[i].cipher_suite->id == ch->esni.cipher->id)
                break;
        if ((*esni)->cipher_suites[i].cipher_suite == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        if (memcmp((*esni)->cipher_suites[i].record_digest, ch->esni.record_digest, ch->esni.cipher->hash->digest_size) == 0) {
            (*secret)->version = (*esni)->version;
            break;
        }
    }
    if (*esni == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* find the matching private key for ESNI decryption */
    for (key_share_ctx = (*esni)->key_exchanges; *key_share_ctx != NULL; ++key_share_ctx)
        if ((*key_share_ctx)->algo->id == ch->esni.key_share->id)
            break;
    if (*key_share_ctx == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* calculate ESNIContents */
    if ((ret = build_esni_contents_hash(ch->esni.cipher->hash, (*secret)->esni_contents_hash, ch->esni.record_digest,
                                        ch->esni.key_share->id, ch->esni.peer_key, ch->random_bytes)) != 0)
        goto Exit;
    /* derive the shared secret */
    if ((ret = (*key_share_ctx)->on_exchange(key_share_ctx, 0, &(*secret)->secret, ch->esni.peer_key)) != 0)
        goto Exit;
    /* decrypt */
    if (ch->esni.encrypted_sni.len - ch->esni.cipher->aead->tag_size != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if ((decrypted = malloc((*esni)->padded_length + PTLS_ESNI_NONCE_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((ret = create_esni_aead(&aead, 0, ch->esni.cipher, (*secret)->secret, (*secret)->esni_contents_hash)) != 0)
        goto Exit;
    if (ptls_aead_decrypt(aead, decrypted, ch->esni.encrypted_sni.base, ch->esni.encrypted_sni.len, 0, ch->key_shares.base,
                          ch->key_shares.len) != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ptls_aead_free(aead);
    aead = NULL;

    { /* decode sni */
        const uint8_t *src = decrypted, *const end = src + (*esni)->padded_length;
        ptls_iovec_t found_name;
        if (end - src < PTLS_ESNI_NONCE_SIZE) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        memcpy((*secret)->nonce, src, PTLS_ESNI_NONCE_SIZE);
        src += PTLS_ESNI_NONCE_SIZE;
        if ((ret = client_hello_decode_server_name(&found_name, &src, end)) != 0)
            goto Exit;
        for (; src != end; ++src) {
            if (*src != '\0') {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
        /* if successful, reuse memory allocated for padded_server_name for storing the found name (freed by the caller) */
        memmove(decrypted, found_name.base, found_name.len);
        *server_name = ptls_iovec_init(decrypted, found_name.len);
        decrypted = NULL;
    }

    ret = 0;
Exit:
    if (decrypted != NULL)
        free(decrypted);
    if (aead != NULL)
        ptls_aead_free(aead);
    if (ret != 0 && *secret != NULL)
        free_esni_secret(secret, 1);
    return ret;
}